

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O0

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::string
          (ImGuiDrawListGraphicsAdaptor *this,float x,float y,string *s,color *c,float align_x,
          float align_y)

{
  ImU32 IVar1;
  ImVec2 *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  ImVec2 sz;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  ImVec2 text_begin;
  undefined4 in_stack_ffffffffffffff90;
  ImU32 in_stack_ffffffffffffff94;
  ImDrawList *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  ImVec2 local_50 [3];
  ImVec2 local_38;
  ImVec2 local_30;
  float local_28;
  float local_24;
  float local_10;
  float local_c;
  
  if ((0.0 < in_XMM2_Da) || (0.0 < in_XMM3_Da)) {
    local_28 = in_XMM3_Da;
    local_24 = in_XMM2_Da;
    local_10 = in_XMM1_Da;
    local_c = in_XMM0_Da;
    std::__cxx11::string::c_str();
    local_30 = ImGui::CalcTextSize(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                                   SUB81((ulong)in_RDI >> 0x38,0),SUB84(in_RDI,0));
    text_begin = *in_RDI;
    ImVec2::ImVec2(&local_38,-local_24 * local_30.x + local_c,-local_28 * local_30.y + local_10);
    ImColor::ImColor((ImColor *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     text_begin.y,text_begin.x,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    IVar1 = ImColor::operator_cast_to_unsigned_int((ImColor *)0x197af9);
    std::__cxx11::string::c_str();
    ImDrawList::AddText(in_stack_ffffffffffffffa0,in_RDI,IVar1,(char *)text_begin,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  else {
    ImVec2::ImVec2(local_50,in_XMM0_Da,in_XMM1_Da);
    ImColor::ImColor((ImColor *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (float)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     SUB84(in_stack_ffffffffffffff88,0),in_stack_ffffffffffffff84,
                     in_stack_ffffffffffffff80);
    IVar1 = ImColor::operator_cast_to_unsigned_int((ImColor *)0x197b91);
    std::__cxx11::string::c_str();
    ImDrawList::AddText(in_stack_ffffffffffffffa0,in_RDI,in_stack_ffffffffffffff94,
                        in_stack_ffffffffffffff88,(char *)CONCAT44(IVar1,in_stack_ffffffffffffff80))
    ;
  }
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::string(float x, float y,
                                          const std::string& s,
                                          const color::color& c, float align_x,
                                          float align_y) {
    // String using ImGui API
    if (align_x > 0. || align_y > 0.) {
        ImVec2 sz = ImGui::CalcTextSize(s.c_str());
        draw_list->AddText(ImVec2(x - align_x * sz.x, y - align_y * sz.y),
                           ImColor(c.r, c.g, c.b, c.a), s.c_str());
    } else {
        draw_list->AddText(ImVec2(x, y), ImColor(c.r, c.g, c.b, c.a),
                           s.c_str());
    }
}